

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

CURLcode Curl_mime_prepare_headers
                   (Curl_easy *data,curl_mimepart *part,char *contenttype,char *disposition,
                   mimestrategy strategy)

{
  curl_slist **slp;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  _Bool _Var4;
  CURLcode CVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  char **ppcVar9;
  char *pcVar10;
  char *pcVar11;
  curl_mimepart *part_00;
  char *pcVar12;
  char *local_50;
  
  curl_slist_free_all(part->curlheaders);
  part->curlheaders = (curl_slist *)0x0;
  if ((part->state).state == MIMESTATE_CURLHEADERS) {
    (part->state).ptr = (void *)0x0;
    (part->state).offset = 0;
  }
  pcVar7 = part->mimetype;
  if (pcVar7 == (char *)0x0) {
    pcVar7 = search_header(part->userheaders,"Content-Type",0xc);
  }
  if (pcVar7 != (char *)0x0) {
    contenttype = pcVar7;
  }
  if (contenttype == (char *)0x0) {
    if (part->kind == MIMEKIND_MULTIPART) {
      contenttype = "multipart/mixed";
    }
    else if (part->kind == MIMEKIND_FILE) {
      contenttype = Curl_mime_contenttype(part->filename);
      if (((contenttype == (char *)0x0) &&
          (contenttype = Curl_mime_contenttype(part->data), contenttype == (char *)0x0)) &&
         (contenttype = "application/octet-stream", part->filename == (char *)0x0)) {
        contenttype = (char *)0x0;
      }
    }
    else {
      contenttype = Curl_mime_contenttype(part->filename);
    }
  }
  if (part->kind == MIMEKIND_MULTIPART) {
    part_00 = (curl_mimepart *)part->arg;
    ppcVar9 = &part_00->data;
    if (part_00 == (curl_mimepart *)0x0) {
      ppcVar9 = (char **)0x0;
    }
  }
  else {
    if (((pcVar7 == (char *)0x0) && (contenttype != (char *)0x0)) &&
       ((_Var4 = content_type_match(contenttype,"text/plain",10), _Var4 &&
        ((strategy == MIMESTRATEGY_MAIL || (part->filename == (char *)0x0)))))) {
      contenttype = (char *)0x0;
    }
    part_00 = (curl_mimepart *)0x0;
    ppcVar9 = (char **)0x0;
  }
  slp = &part->curlheaders;
  pcVar7 = search_header(part->userheaders,"Content-Disposition",0x13);
  if (pcVar7 == (char *)0x0) {
    if (((disposition != (char *)0x0) || (disposition = "attachment", part->filename != (char *)0x0)
        ) || (part->name != (char *)0x0)) {
LAB_004b9759:
      iVar6 = curl_strequal(disposition,"attachment");
      pcVar7 = part->name;
      CVar5 = CURLE_OUT_OF_MEMORY;
      if (iVar6 == 0) {
        if (pcVar7 != (char *)0x0) goto LAB_004b978f;
LAB_004b97b5:
        pcVar7 = (char *)0x0;
LAB_004b97b7:
        if (part->filename == (char *)0x0) {
          local_50 = (char *)0x0;
        }
        else {
          local_50 = escape_string(data,part->filename,strategy);
          if (local_50 == (char *)0x0) {
            local_50 = (char *)0x0;
            goto LAB_004b985d;
          }
        }
        pcVar8 = "; name=\"";
        pcVar10 = pcVar7;
        if (pcVar7 == (char *)0x0) {
          pcVar8 = "";
          pcVar10 = "";
        }
        pcVar2 = "\n\t\t\t\"";
        pcVar3 = "\n\t\t\t\"";
        if (pcVar7 == (char *)0x0) {
          pcVar3 = "PK\x01\x02";
        }
        pcVar11 = "; filename=\"";
        pcVar12 = local_50;
        if (local_50 == (char *)0x0) {
          pcVar11 = "";
          pcVar12 = "";
          pcVar2 = "PK\x01\x02";
        }
        CVar5 = Curl_mime_add_header
                          (slp,"Content-Disposition: %s%s%s%s%s%s%s",disposition,pcVar8,pcVar10,
                           pcVar3 + 4,pcVar11,pcVar12,pcVar2 + 4);
      }
      else {
        if (pcVar7 == (char *)0x0) {
          if (part->filename == (char *)0x0) goto LAB_004b96f1;
          goto LAB_004b97b5;
        }
LAB_004b978f:
        pcVar7 = escape_string(data,pcVar7,strategy);
        if (pcVar7 != (char *)0x0) goto LAB_004b97b7;
        local_50 = (char *)0x0;
        pcVar7 = (char *)0x0;
      }
LAB_004b985d:
      (*Curl_cfree)(pcVar7);
      (*Curl_cfree)(local_50);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      goto LAB_004b96f1;
    }
    if (contenttype == (char *)0x0) goto LAB_004b989f;
    iVar6 = curl_strnequal(contenttype,"multipart/",10);
    if (iVar6 == 0) goto LAB_004b9759;
LAB_004b96fa:
    pcVar7 = "; boundary=";
    if (ppcVar9 == (char **)0x0) {
      pcVar7 = "";
      ppcVar9 = (char **)0x6e9b79;
    }
    CVar5 = Curl_mime_add_header(slp,"Content-Type: %s%s%s",contenttype,pcVar7,ppcVar9);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    bVar1 = true;
  }
  else {
LAB_004b96f1:
    if (contenttype != (char *)0x0) goto LAB_004b96fa;
LAB_004b989f:
    bVar1 = false;
  }
  pcVar7 = search_header(part->userheaders,"Content-Transfer-Encoding",0x19);
  if (pcVar7 == (char *)0x0) {
    if (part->encoder == (mime_encoder *)0x0) {
      if ((!bVar1 || strategy != MIMESTRATEGY_MAIL) || (part->kind == MIMEKIND_MULTIPART))
      goto LAB_004b98b9;
      pcVar7 = "8bit";
    }
    else {
      pcVar7 = part->encoder->name;
      if (pcVar7 == (char *)0x0) goto LAB_004b98b9;
    }
    CVar5 = Curl_mime_add_header(slp,"Content-Transfer-Encoding: %s",pcVar7);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
  }
LAB_004b98b9:
  if ((part->state).state == MIMESTATE_CURLHEADERS) {
    (part->state).ptr = part->curlheaders;
    (part->state).offset = 0;
  }
  CVar5 = CURLE_OK;
  if ((part_00 != (curl_mimepart *)0x0) && (part->kind == MIMEKIND_MULTIPART)) {
    _Var4 = content_type_match(contenttype,"multipart/form-data",0x13);
    pcVar7 = "form-data";
    if (!_Var4) {
      pcVar7 = (char *)0x0;
    }
    do {
      part_00 = part_00->nextpart;
      if (part_00 == (curl_mimepart *)0x0) {
        return CURLE_OK;
      }
      CVar5 = Curl_mime_prepare_headers(data,part_00,(char *)0x0,pcVar7,strategy);
    } while (CVar5 == CURLE_OK);
  }
  return CVar5;
}

Assistant:

CURLcode Curl_mime_prepare_headers(struct Curl_easy *data,
                                   curl_mimepart *part,
                                   const char *contenttype,
                                   const char *disposition,
                                   enum mimestrategy strategy)
{
  curl_mime *mime = NULL;
  const char *boundary = NULL;
  char *customct;
  const char *cte = NULL;
  CURLcode ret = CURLE_OK;

  /* Get rid of previously prepared headers. */
  curl_slist_free_all(part->curlheaders);
  part->curlheaders = NULL;

  /* Be sure we won't access old headers later. */
  if(part->state.state == MIMESTATE_CURLHEADERS)
    mimesetstate(&part->state, MIMESTATE_CURLHEADERS, NULL);

  /* Check if content type is specified. */
  customct = part->mimetype;
  if(!customct)
    customct = search_header(part->userheaders, STRCONST("Content-Type"));
  if(customct)
    contenttype = customct;

  /* If content type is not specified, try to determine it. */
  if(!contenttype) {
    switch(part->kind) {
    case MIMEKIND_MULTIPART:
      contenttype = MULTIPART_CONTENTTYPE_DEFAULT;
      break;
    case MIMEKIND_FILE:
      contenttype = Curl_mime_contenttype(part->filename);
      if(!contenttype)
        contenttype = Curl_mime_contenttype(part->data);
      if(!contenttype && part->filename)
        contenttype = FILE_CONTENTTYPE_DEFAULT;
      break;
    default:
      contenttype = Curl_mime_contenttype(part->filename);
      break;
    }
  }

  if(part->kind == MIMEKIND_MULTIPART) {
    mime = (curl_mime *) part->arg;
    if(mime)
      boundary = mime->boundary;
  }
  else if(contenttype && !customct &&
          content_type_match(contenttype, STRCONST("text/plain")))
    if(strategy == MIMESTRATEGY_MAIL || !part->filename)
      contenttype = NULL;

  /* Issue content-disposition header only if not already set by caller. */
  if(!search_header(part->userheaders, STRCONST("Content-Disposition"))) {
    if(!disposition)
      if(part->filename || part->name ||
        (contenttype && !strncasecompare(contenttype, "multipart/", 10)))
          disposition = DISPOSITION_DEFAULT;
    if(disposition && curl_strequal(disposition, "attachment") &&
     !part->name && !part->filename)
      disposition = NULL;
    if(disposition) {
      char *name = NULL;
      char *filename = NULL;

      if(part->name) {
        name = escape_string(data, part->name, strategy);
        if(!name)
          ret = CURLE_OUT_OF_MEMORY;
      }
      if(!ret && part->filename) {
        filename = escape_string(data, part->filename, strategy);
        if(!filename)
          ret = CURLE_OUT_OF_MEMORY;
      }
      if(!ret)
        ret = Curl_mime_add_header(&part->curlheaders,
                                   "Content-Disposition: %s%s%s%s%s%s%s",
                                   disposition,
                                   name? "; name=\"": "",
                                   name? name: "",
                                   name? "\"": "",
                                   filename? "; filename=\"": "",
                                   filename? filename: "",
                                   filename? "\"": "");
      Curl_safefree(name);
      Curl_safefree(filename);
      if(ret)
        return ret;
      }
    }

  /* Issue Content-Type header. */
  if(contenttype) {
    ret = add_content_type(&part->curlheaders, contenttype, boundary);
    if(ret)
      return ret;
  }

  /* Content-Transfer-Encoding header. */
  if(!search_header(part->userheaders,
                    STRCONST("Content-Transfer-Encoding"))) {
    if(part->encoder)
      cte = part->encoder->name;
    else if(contenttype && strategy == MIMESTRATEGY_MAIL &&
     part->kind != MIMEKIND_MULTIPART)
      cte = "8bit";
    if(cte) {
      ret = Curl_mime_add_header(&part->curlheaders,
                                 "Content-Transfer-Encoding: %s", cte);
      if(ret)
        return ret;
    }
  }

  /* If we were reading curl-generated headers, restart with new ones (this
     should not occur). */
  if(part->state.state == MIMESTATE_CURLHEADERS)
    mimesetstate(&part->state, MIMESTATE_CURLHEADERS, part->curlheaders);

  /* Process subparts. */
  if(part->kind == MIMEKIND_MULTIPART && mime) {
    curl_mimepart *subpart;

    disposition = NULL;
    if(content_type_match(contenttype, STRCONST("multipart/form-data")))
      disposition = "form-data";
    for(subpart = mime->firstpart; subpart; subpart = subpart->nextpart) {
      ret = Curl_mime_prepare_headers(data, subpart, NULL,
                                      disposition, strategy);
      if(ret)
        return ret;
    }
  }
  return ret;
}